

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImageRounded
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col,float rounding,int rounding_corners)

{
  int iVar1;
  bool bVar2;
  value_type *ppvVar3;
  bool bVar4;
  int vert_end_idx;
  int vert_start_idx;
  bool push_texture_id;
  float rounding_local;
  ImVec2 *uv_b_local;
  ImVec2 *uv_a_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImTextureID user_texture_id_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    if ((rounding <= 0.0) || ((rounding_corners & 0xfU) == 0)) {
      AddImage(this,user_texture_id,a,b,uv_a,uv_b,col);
    }
    else {
      bVar2 = ImVector<void_*>::empty(&this->_TextureIdStack);
      bVar4 = true;
      if (!bVar2) {
        ppvVar3 = ImVector<void_*>::back(&this->_TextureIdStack);
        bVar4 = user_texture_id != *ppvVar3;
      }
      if (bVar4) {
        PushTextureID(this,user_texture_id);
      }
      iVar1 = (this->VtxBuffer).Size;
      PathRect(this,a,b,rounding,rounding_corners);
      PathFillConvex(this,col);
      ImGui::ShadeVertsLinearUV
                ((this->VtxBuffer).Data + iVar1,(this->VtxBuffer).Data + (this->VtxBuffer).Size,a,b,
                 uv_a,uv_b,true);
      if (bVar4) {
        PopTextureID(this);
      }
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImageRounded(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col, float rounding, int rounding_corners)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (rounding <= 0.0f || (rounding_corners & ImDrawCornerFlags_All) == 0)
    {
        AddImage(user_texture_id, a, b, uv_a, uv_b, col);
        return;
    }

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    int vert_start_idx = VtxBuffer.Size;
    PathRect(a, b, rounding, rounding_corners);
    PathFillConvex(col);
    int vert_end_idx = VtxBuffer.Size;
    ImGui::ShadeVertsLinearUV(VtxBuffer.Data + vert_start_idx, VtxBuffer.Data + vert_end_idx, a, b, uv_a, uv_b, true);

    if (push_texture_id)
        PopTextureID();
}